

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O0

void mpr_print_addr_set(avl_tree *set)

{
  list_entity *plVar1;
  oonf_log_source source;
  char *pcVar2;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  netaddr_str buf1;
  addr_node *current_node;
  avl_tree *set_local;
  
  plVar1 = (set->list_head).next;
  while( true ) {
    source = LOG_MPR;
    buf1.buf._54_8_ = &plVar1[-2].prev;
    if (plVar1->prev == (set->list_head).prev) break;
    if ((log_global_mask[LOG_MPR] & 1) != 0) {
      pcVar2 = netaddr_to_prefixstring
                         ((netaddr_str *)((long)&__tempptr + 2),(netaddr *)buf1.buf._54_8_,false);
      oonf_log(LOG_SEVERITY_DEBUG,source,"src/nhdp/mpr/neighbor-graph.c",0xe1,(void *)0x0,0,"%s",
               pcVar2);
    }
    plVar1 = *(list_entity **)(buf1.buf._54_8_ + 0x18);
  }
  return;
}

Assistant:

void
mpr_print_addr_set(struct avl_tree *set) {
  struct addr_node *current_node;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf1;
#endif

  avl_for_each_element(set, current_node, _avl_node) {
    OONF_DEBUG(LOG_MPR, "%s", netaddr_to_string(&buf1, &current_node->addr));
  }
}